

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void print_mat(FILE *out,char *indent,m256v *M)

{
  byte bVar1;
  char *pcVar2;
  int *in_RDX;
  undefined8 in_RSI;
  FILE *in_RDI;
  int c;
  int r;
  FILE *__stream;
  int iVar3;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < *in_RDX; iVar4 = iVar4 + 1) {
    pcVar2 = " ";
    if (iVar4 == 0) {
      pcVar2 = "[";
    }
    fprintf(in_RDI,"%s%s",in_RSI,pcVar2);
    for (iVar3 = 0; iVar3 < in_RDX[1]; iVar3 = iVar3 + 1) {
      __stream = in_RDI;
      bVar1 = m256v_get_el((m256v *)CONCAT44(iVar4,iVar3),(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      fprintf(__stream," %02x",(ulong)bVar1);
    }
    pcVar2 = "";
    if (iVar4 == *in_RDX + -1) {
      pcVar2 = " ]";
    }
    fprintf(in_RDI,"%s\n",pcVar2);
  }
  return;
}

Assistant:

UNUSED
static void print_mat(FILE* out, const char* indent, const m256v* M)
{
	for (int r = 0; r < M->n_row; ++r) {
		fprintf(out, "%s%s", indent, (r == 0 ? "[" : " "));
		for (int c = 0; c < M->n_col; ++c) {
			fprintf(out, " %02x", (int)m256v_get_el(M, r, c));
		}
		fprintf(out, "%s\n", ((r == M->n_row - 1) ? " ]" : ""));
	}
}